

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O1

uint32_t __thiscall
FastPForLib::SIMDPFor::compressblockPFOR
          (SIMDPFor *this,DATATYPE *in,uint32_t *outputbegin,uint32_t b,DATATYPE **exceptions)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer puVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if (b == 0x20) {
    memcpy(outputbegin,in,0x200);
  }
  else {
    uVar12 = 1 << (b & 0x1f);
    puVar5 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    uVar9 = 0;
    do {
      puVar5[uVar9] = (uint)lVar7;
      uVar9 = (uVar9 + 1) - (ulong)(in[lVar7] < uVar12);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x80);
    if (uVar9 != 0) {
      pvVar1 = &this->codedcopy;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar1,in,in + 0x80);
      uVar2 = *(this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (ulong)uVar2;
      uVar3 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8];
      puVar6 = *exceptions;
      *exceptions = puVar6 + 1;
      *puVar6 = uVar3;
      if (b < 7) {
        if (uVar9 != 1) {
          uVar11 = 1;
          do {
            uVar3 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar11];
            uVar10 = (uint)uVar8;
            while (uVar10 + uVar12 < uVar3) {
              uVar10 = uVar12 + (int)uVar8;
              uVar4 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar10];
              puVar6 = *exceptions;
              *exceptions = puVar6 + 1;
              *puVar6 = uVar4;
              (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8] = uVar12 - 1;
              uVar8 = (ulong)uVar10;
            }
            uVar4 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar3];
            puVar6 = *exceptions;
            *exceptions = puVar6 + 1;
            *puVar6 = uVar4;
            (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar10] = ~uVar10 + uVar3;
            uVar11 = (ulong)((int)uVar11 + 1);
            uVar8 = (ulong)uVar3;
          } while (uVar11 < uVar9);
        }
      }
      else if (uVar9 != 1) {
        uVar11 = 1;
        uVar12 = 2;
        do {
          uVar3 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11];
          uVar10 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar3];
          puVar6 = *exceptions;
          *exceptions = puVar6 + 1;
          *puVar6 = uVar10;
          (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = ~(uint)uVar8 + uVar3;
          uVar11 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
          uVar8 = (ulong)uVar3;
        } while (uVar11 < uVar9);
      }
      usimdpack((pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,(__m128i *)outputbegin,b);
      return uVar2;
    }
    usimdpack(in,(__m128i *)outputbegin,b);
  }
  return 0x80;
}

Assistant:

uint32_t compressblockPFOR(const DATATYPE *__restrict__ in,
                             uint32_t *__restrict__ outputbegin,
                             const uint32_t b,
                             DATATYPE *__restrict__ &exceptions) {
    if (b == 32) {
      for (size_t k = 0; k < BlockSize; ++k)
        *(outputbegin++) = *(in++);
      return BlockSize;
    }
    size_t exceptcounter = 0;
    const uint32_t maxgap = 1U << b;
    {
      std::vector<uint32_t>::iterator cci = codedcopy.begin();
      for (uint32_t k = 0; k < BlockSize; ++k, ++cci) {
        miss[exceptcounter] = k;
        exceptcounter += (in[k] >= maxgap);
      }
    }
    if (exceptcounter == 0) {
      packblock(in, outputbegin, b);
      return BlockSize;
    }
    codedcopy.assign(in, in + BlockSize);
    uint32_t firstexcept = miss[0];
    uint32_t prev = 0;
    *(exceptions++) = codedcopy[firstexcept];
    prev = firstexcept;
    if (maxgap < BlockSize) {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        // they don't include this part, but it is required:
        while (cur > maxgap + prev) {
          // compulsory exception
          uint32_t compulcur = prev + maxgap;
          *(exceptions++) = codedcopy[compulcur];
          codedcopy[prev] = maxgap - 1;
          prev = compulcur;
        }
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    } else {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    }
    packblock(&codedcopy[0], outputbegin, b);
    return firstexcept;
  }